

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong uVar14;
  Primitive *prim;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined4 uVar22;
  ulong unaff_R14;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1031;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  ulong local_1008;
  ulong local_1000;
  undefined1 (*local_ff8) [16];
  ulong local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_ff8 = (undefined1 (*) [16])local_f68;
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar3 = (ray->super_RayK<1>).dir.field_0;
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx((undefined1  [16])aVar3,auVar25);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar25,auVar41,1);
      auVar25 = vblendvps_avx((undefined1  [16])aVar3,auVar41,auVar25);
      auVar41 = vrcpps_avx(auVar25);
      fVar7 = auVar41._0_4_;
      auVar30._0_4_ = auVar25._0_4_ * fVar7;
      fVar8 = auVar41._4_4_;
      auVar30._4_4_ = auVar25._4_4_ * fVar8;
      fVar9 = auVar41._8_4_;
      auVar30._8_4_ = auVar25._8_4_ * fVar9;
      fVar10 = auVar41._12_4_;
      auVar30._12_4_ = auVar25._12_4_ * fVar10;
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = &DAT_3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar42,auVar30);
      auVar31._0_4_ = fVar7 + fVar7 * auVar25._0_4_;
      auVar31._4_4_ = fVar8 + fVar8 * auVar25._4_4_;
      auVar31._8_4_ = fVar9 + fVar9 * auVar25._8_4_;
      auVar31._12_4_ = fVar10 + fVar10 * auVar25._12_4_;
      uVar22 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_f88._4_4_ = uVar22;
      local_f88._0_4_ = uVar22;
      local_f88._8_4_ = uVar22;
      local_f88._12_4_ = uVar22;
      auVar46 = ZEXT1664(local_f88);
      uVar22 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_f98._4_4_ = uVar22;
      local_f98._0_4_ = uVar22;
      local_f98._8_4_ = uVar22;
      local_f98._12_4_ = uVar22;
      auVar47 = ZEXT1664(local_f98);
      uVar22 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_fa8._4_4_ = uVar22;
      local_fa8._0_4_ = uVar22;
      local_fa8._8_4_ = uVar22;
      local_fa8._12_4_ = uVar22;
      auVar48 = ZEXT1664(local_fa8);
      local_fb8 = vshufps_avx(auVar31,auVar31,0);
      auVar49 = ZEXT1664(local_fb8);
      auVar25 = vmovshdup_avx(auVar31);
      local_fc8 = vshufps_avx(auVar31,auVar31,0x55);
      auVar50 = ZEXT1664(local_fc8);
      auVar41 = vshufpd_avx(auVar31,auVar31,1);
      local_1000 = (ulong)(auVar31._0_4_ < 0.0) << 4;
      local_fd8 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar51 = ZEXT1664(local_fd8);
      local_1008 = (ulong)(auVar25._0_4_ < 0.0) << 4 | 0x20;
      local_1020 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x40;
      local_1028 = local_1000 ^ 0x10;
      local_1030 = local_1008 ^ 0x10;
      local_ff0 = local_1020 ^ 0x10;
      local_fe8 = vshufps_avx(auVar27,auVar27,0);
      auVar52 = ZEXT1664(local_fe8);
      auVar25 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = ZEXT1664(auVar25);
      uVar15 = local_1008;
      uVar17 = local_1020;
      uVar18 = local_1028;
      uVar19 = local_1030;
      uVar20 = local_1000;
      do {
        do {
          if (local_ff8 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar11 = local_ff8 + -1;
          local_ff8 = local_ff8 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar11 + 8));
        uVar14 = *(ulong *)*local_ff8;
        do {
          if ((uVar14 & 8) == 0) {
            uVar13 = uVar14 & 0xfffffffffffffff0;
            fVar7 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar24._4_4_ = fVar7;
            auVar24._0_4_ = fVar7;
            auVar24._8_4_ = fVar7;
            auVar24._12_4_ = fVar7;
            pfVar2 = (float *)(uVar13 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar20);
            auVar27._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar27._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar27._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar27._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar27,auVar46._0_16_);
            auVar28._0_4_ = auVar49._0_4_ * auVar25._0_4_;
            auVar28._4_4_ = auVar49._4_4_ * auVar25._4_4_;
            auVar28._8_4_ = auVar49._8_4_ * auVar25._8_4_;
            auVar28._12_4_ = auVar49._12_4_ * auVar25._12_4_;
            auVar25 = vmaxps_avx(auVar52._0_16_,auVar28);
            pfVar2 = (float *)(uVar13 + 0x80 + uVar15);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar15);
            auVar32._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar32._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar32._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar32._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar27 = vsubps_avx(auVar32,auVar47._0_16_);
            auVar33._0_4_ = auVar50._0_4_ * auVar27._0_4_;
            auVar33._4_4_ = auVar50._4_4_ * auVar27._4_4_;
            auVar33._8_4_ = auVar50._8_4_ * auVar27._8_4_;
            auVar33._12_4_ = auVar50._12_4_ * auVar27._12_4_;
            pfVar2 = (float *)(uVar13 + 0x80 + uVar17);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar17);
            auVar37._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar37._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar37._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar37._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar27 = vsubps_avx(auVar37,auVar48._0_16_);
            auVar38._0_4_ = auVar51._0_4_ * auVar27._0_4_;
            auVar38._4_4_ = auVar51._4_4_ * auVar27._4_4_;
            auVar38._8_4_ = auVar51._8_4_ * auVar27._8_4_;
            auVar38._12_4_ = auVar51._12_4_ * auVar27._12_4_;
            auVar27 = vmaxps_avx(auVar33,auVar38);
            local_1018 = vmaxps_avx(auVar25,auVar27);
            pfVar2 = (float *)(uVar13 + 0x80 + uVar18);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar18);
            auVar34._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar34._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar34._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar34._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar34,auVar46._0_16_);
            auVar35._0_4_ = auVar49._0_4_ * auVar25._0_4_;
            auVar35._4_4_ = auVar49._4_4_ * auVar25._4_4_;
            auVar35._8_4_ = auVar49._8_4_ * auVar25._8_4_;
            auVar35._12_4_ = auVar49._12_4_ * auVar25._12_4_;
            pfVar2 = (float *)(uVar13 + 0x80 + uVar19);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar19);
            auVar39._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar39._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar39._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar39._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar39,auVar47._0_16_);
            auVar40._0_4_ = auVar50._0_4_ * auVar25._0_4_;
            auVar40._4_4_ = auVar50._4_4_ * auVar25._4_4_;
            auVar40._8_4_ = auVar50._8_4_ * auVar25._8_4_;
            auVar40._12_4_ = auVar50._12_4_ * auVar25._12_4_;
            pfVar2 = (float *)(uVar13 + 0x80 + local_ff0);
            pfVar1 = (float *)(uVar13 + 0x20 + local_ff0);
            auVar43._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar43._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar43._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar43._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar43,auVar48._0_16_);
            auVar44._0_4_ = auVar51._0_4_ * auVar25._0_4_;
            auVar44._4_4_ = auVar51._4_4_ * auVar25._4_4_;
            auVar44._8_4_ = auVar51._8_4_ * auVar25._8_4_;
            auVar44._12_4_ = auVar51._12_4_ * auVar25._12_4_;
            auVar25 = vminps_avx(auVar40,auVar44);
            auVar27 = vminps_avx(auVar23._0_16_,auVar35);
            auVar25 = vminps_avx(auVar27,auVar25);
            if (((uint)uVar14 & 7) == 6) {
              auVar27 = vcmpps_avx(local_1018,auVar25,2);
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar13 + 0xe0),auVar24,2);
              auVar24 = vcmpps_avx(auVar24,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
              auVar25 = vandps_avx(auVar25,auVar24);
              auVar25 = vandps_avx(auVar25,auVar27);
            }
            else {
              auVar25 = vcmpps_avx(local_1018,auVar25,2);
            }
            auVar25 = vpslld_avx(auVar25,0x1f);
            uVar22 = vmovmskps_avx(auVar25);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar22);
          }
          if ((uVar14 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar12 = 4;
            }
            else {
              uVar13 = uVar14 & 0xfffffffffffffff0;
              lVar21 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              iVar12 = 0;
              uVar14 = *(ulong *)(uVar13 + lVar21 * 8);
              uVar16 = unaff_R14 - 1 & unaff_R14;
              if (uVar16 != 0) {
                uVar4 = *(uint *)(local_1018 + lVar21 * 4);
                lVar21 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                uVar6 = *(ulong *)(uVar13 + lVar21 * 8);
                uVar5 = *(uint *)(local_1018 + lVar21 * 4);
                uVar16 = uVar16 - 1 & uVar16;
                uVar17 = local_1020;
                uVar18 = local_1028;
                uVar19 = local_1030;
                if (uVar16 == 0) {
                  if (uVar4 < uVar5) {
                    *(ulong *)*local_ff8 = uVar6;
                    *(uint *)(*local_ff8 + 8) = uVar5;
                    local_ff8 = local_ff8 + 1;
                  }
                  else {
                    *(ulong *)*local_ff8 = uVar14;
                    *(uint *)(*local_ff8 + 8) = uVar4;
                    uVar14 = uVar6;
                    local_ff8 = local_ff8 + 1;
                  }
                }
                else {
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = uVar14;
                  auVar25 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar4));
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = uVar6;
                  auVar27 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar5));
                  lVar21 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                    }
                  }
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = *(ulong *)(uVar13 + lVar21 * 8);
                  auVar41 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_1018 + lVar21 * 4)));
                  auVar24 = vpcmpgtd_avx(auVar27,auVar25);
                  uVar16 = uVar16 - 1 & uVar16;
                  if (uVar16 == 0) {
                    auVar30 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar27,auVar25,auVar30);
                    auVar25 = vblendvps_avx(auVar25,auVar27,auVar30);
                    auVar27 = vpcmpgtd_avx(auVar41,auVar24);
                    auVar30 = vpshufd_avx(auVar27,0xaa);
                    auVar27 = vblendvps_avx(auVar41,auVar24,auVar30);
                    auVar24 = vblendvps_avx(auVar24,auVar41,auVar30);
                    auVar41 = vpcmpgtd_avx(auVar24,auVar25);
                    auVar30 = vpshufd_avx(auVar41,0xaa);
                    auVar41 = vblendvps_avx(auVar24,auVar25,auVar30);
                    auVar25 = vblendvps_avx(auVar25,auVar24,auVar30);
                    *local_ff8 = auVar25;
                    local_ff8[1] = auVar41;
                    uVar14 = auVar27._0_8_;
                    local_ff8 = local_ff8 + 2;
                  }
                  else {
                    lVar21 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = *(ulong *)(uVar13 + lVar21 * 8);
                    auVar31 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_1018 + lVar21 * 4)));
                    auVar30 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar27,auVar25,auVar30);
                    auVar25 = vblendvps_avx(auVar25,auVar27,auVar30);
                    auVar27 = vpcmpgtd_avx(auVar31,auVar41);
                    auVar30 = vpshufd_avx(auVar27,0xaa);
                    auVar27 = vblendvps_avx(auVar31,auVar41,auVar30);
                    auVar41 = vblendvps_avx(auVar41,auVar31,auVar30);
                    auVar30 = vpcmpgtd_avx(auVar41,auVar25);
                    auVar31 = vpshufd_avx(auVar30,0xaa);
                    auVar30 = vblendvps_avx(auVar41,auVar25,auVar31);
                    auVar25 = vblendvps_avx(auVar25,auVar41,auVar31);
                    auVar41 = vpcmpgtd_avx(auVar27,auVar24);
                    auVar31 = vpshufd_avx(auVar41,0xaa);
                    auVar41 = vblendvps_avx(auVar27,auVar24,auVar31);
                    auVar27 = vblendvps_avx(auVar24,auVar27,auVar31);
                    auVar24 = vpcmpgtd_avx(auVar30,auVar27);
                    auVar31 = vpshufd_avx(auVar24,0xaa);
                    auVar24 = vblendvps_avx(auVar30,auVar27,auVar31);
                    auVar27 = vblendvps_avx(auVar27,auVar30,auVar31);
                    *local_ff8 = auVar25;
                    local_ff8[1] = auVar27;
                    local_ff8[2] = auVar24;
                    uVar14 = auVar41._0_8_;
                    local_ff8 = local_ff8 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar12 = 6;
          }
        } while (iVar12 == 0);
        if (iVar12 == 6) {
          lVar21 = (ulong)((uint)uVar14 & 0xf) - 8;
          if (lVar21 != 0) {
            prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
            do {
              InstanceArrayIntersector1MB::intersect(&local_1031,ray,context,prim);
              prim = prim + 1;
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
          }
          fVar7 = (ray->super_RayK<1>).tfar;
          auVar23 = ZEXT1664(CONCAT412(fVar7,CONCAT48(fVar7,CONCAT44(fVar7,fVar7))));
          auVar46 = ZEXT1664(local_f88);
          auVar47 = ZEXT1664(local_f98);
          auVar48 = ZEXT1664(local_fa8);
          auVar49 = ZEXT1664(local_fb8);
          auVar50 = ZEXT1664(local_fc8);
          auVar51 = ZEXT1664(local_fd8);
          auVar52 = ZEXT1664(local_fe8);
          uVar15 = local_1008;
          uVar17 = local_1020;
          uVar18 = local_1028;
          uVar19 = local_1030;
          uVar20 = local_1000;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }